

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

void DumpClassMap(FClassMap *themap)

{
  uint uVar1;
  Node *pNVar2;
  uint *puVar3;
  bool bVar4;
  Node *pNVar5;
  hash_t hVar6;
  void *__base;
  IPair *in_RSI;
  uint uVar7;
  IPair *pIVar8;
  ulong uVar9;
  ulong uVar10;
  
  hVar6 = TMap<int,_PClassActor_*,_THashTraits<int>,_TValueTraits<PClassActor_*>_>::CountUsed
                    (themap);
  __base = operator_new__((ulong)hVar6 << 3);
  uVar1 = themap->Size;
  pNVar2 = themap->Nodes;
  uVar10 = 0;
  uVar7 = 0;
  do {
    if (uVar7 < uVar1) {
      pNVar5 = pNVar2 + uVar7;
      do {
        pIVar8 = &pNVar5->Pair;
        uVar7 = uVar7 + 1;
        if (*(long *)((long)(pIVar8 + -1) + 8) != 1) {
          bVar4 = true;
          in_RSI = pIVar8;
          goto LAB_0045cc85;
        }
        pNVar5 = (Node *)(pIVar8 + 1);
      } while (uVar7 != uVar1);
      bVar4 = false;
      uVar7 = uVar1;
    }
    else {
      bVar4 = false;
    }
LAB_0045cc85:
    if (!bVar4) {
      qsort(__base,uVar10 & 0xffffffff,8,SpawnableSort);
      if (uVar10 != 0) {
        uVar9 = 0;
        do {
          puVar3 = *(uint **)((long)__base + uVar9 * 8);
          Printf("%d %s\n",(ulong)*puVar3,
                 FName::NameData.NameArray[*(int *)(*(long *)(puVar3 + 2) + 0xa0)].Text);
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
      }
      operator_delete__(__base);
      return;
    }
    *(IPair **)((long)__base + uVar10 * 8) = in_RSI;
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

static void DumpClassMap(FClassMap &themap)
{
	FClassMap::Iterator it(themap);
	FClassMap::Pair *pair, **allpairs;
	int i = 0;

	// Sort into numerical order, since their arrangement in the map can
	// be in an unspecified order.
	allpairs = new FClassMap::Pair *[themap.CountUsed()];
	while (it.NextPair(pair))
	{
		allpairs[i++] = pair;
	}
	qsort(allpairs, i, sizeof(*allpairs), SpawnableSort);
	for (int j = 0; j < i; ++j)
	{
		pair = allpairs[j];
		Printf ("%d %s\n", pair->Key, pair->Value->TypeName.GetChars());
	}
	delete[] allpairs;
}